

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellBST.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementShellBST::ComputeInternalForces(ChElementShellBST *this,ChVectorDynamic<> *Fi)

{
  int iVar1;
  ChStateDelta *in_RCX;
  ChState mstate_x;
  ChStateDelta mstate_w;
  ChState local_40;
  ChStateDelta local_28;
  
  iVar1 = (*(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
            _vptr_ChElementBase[0x1b])();
  ChState::ChState(&local_40,(long)iVar1,(ChIntegrable *)0x0);
  iVar1 = (*(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
            _vptr_ChElementBase[0x1c])(this);
  ChStateDelta::ChStateDelta(&local_28,(long)iVar1,(ChIntegrable *)0x0);
  (*(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase
    [0x1d])(this,0,&local_40);
  (*(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase
    [0x1e])(this,0,&local_28);
  ComputeInternalForces_impl(this,Fi,&local_40,in_RCX,false);
  Eigen::internal::handmade_aligned_free
            (local_28.super_ChVectorDynamic<double>.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  Eigen::internal::handmade_aligned_free
            (local_40.super_ChVectorDynamic<double>.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return;
}

Assistant:

void ChElementShellBST::ComputeInternalForces(ChVectorDynamic<>& Fi) {

	ChState mstate_x(this->LoadableGet_ndof_x(), nullptr);
	ChStateDelta mstate_w(this->LoadableGet_ndof_w(), nullptr);
    this->LoadableGetStateBlock_x(0,mstate_x);
    this->LoadableGetStateBlock_w(0,mstate_w);
    ComputeInternalForces_impl(Fi, mstate_x, mstate_w);
}